

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitter.c
# Opt level: O0

int flatcc_emitter_recycle_page(flatcc_emitter_t *E,flatcc_emitter_page_t *p)

{
  flatcc_emitter_page_t *p_local;
  flatcc_emitter_t *E_local;
  
  if ((p == E->front) || (p == E->back)) {
    E_local._4_4_ = -1;
  }
  else {
    p->next->prev = p->prev;
    p->prev->next = p->next;
    p->prev = E->front->prev;
    p->next = E->front;
    p->prev->next = p;
    p->next->prev = p;
    E_local._4_4_ = 0;
  }
  return E_local._4_4_;
}

Assistant:

int flatcc_emitter_recycle_page(flatcc_emitter_t *E, flatcc_emitter_page_t *p)
{
    if (p == E->front || p == E->back) {
        return -1;
    }
    p->next->prev = p->prev;
    p->prev->next = p->next;
    p->prev = E->front->prev;
    p->next = E->front;
    p->prev->next = p;
    p->next->prev = p;
    return 0;
}